

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::generateArguments
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,
          ExpressionList *operands,Literals *arguments)

{
  Flow *in_RAX;
  Flow *extraout_RAX;
  Flow *pFVar1;
  Literal *x;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements;
  if (1 < uVar2) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::reserve
              (&(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible,uVar2 - 1);
    uVar2 = (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
            usedElements;
    in_RAX = extraout_RAX;
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if ((operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pFVar1 = visit(__return_storage_ptr__,this,
                     (operands->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data[uVar3]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        return pFVar1;
      }
      x = Flow::getSingleValue(__return_storage_ptr__);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&arguments->super_SmallVector<wasm::Literal,_1UL>,x);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      in_RAX = (Flow *)wasm::Literal::~Literal
                                 ((__return_storage_ptr__->values).
                                  super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  return in_RAX;
}

Assistant:

Flow generateArguments(const ExpressionList& operands, Literals& arguments) {
    NOTE_ENTER_("generateArguments");
    arguments.reserve(operands.size());
    for (auto expression : operands) {
      Flow flow = self()->visit(expression);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.values);
      arguments.push_back(flow.getSingleValue());
    }
    return Flow();
  }